

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regex.c
# Opt level: O3

int main(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar1 = assert_match(".*","KM0H",1);
  uVar2 = assert_match(".*","",1);
  uVar3 = assert_match("KM0H","KM0H",1);
  uVar4 = assert_match("asdf","KM0H",0);
  uVar5 = assert_match("^(KM0H|KD0JLT)$","KM0H",1);
  uVar6 = assert_match("KM0H|KD0JLT","KM0H",1);
  uVar7 = assert_match("KM0H|KD0JLT","KD0JLT",1);
  uVar8 = assert_match("KM0H|KD0JLT","K",0);
  uVar9 = assert_match("KM0H|KD0JLT","KKM0H",1);
  uVar10 = assert_match("^(KM0H|KD0JLT)$","KKM0H",0);
  return uVar10 | uVar9 | uVar8 | uVar7 | uVar6 | uVar5 | uVar4 | uVar3 | uVar2 | uVar1;
}

Assistant:

int main(void)
{
	int ret = 0;

	ret |= test_regex_catchall();
	ret |= test_regex_catchall_empty();
	ret |= test_regex_exact_match();
	ret |= test_regex_no_match();
	ret |= test_regex_or_exact();
	ret |= test_regex_or_first();
	ret |= test_regex_or_second();
	ret |= test_regex_or_substring();
	ret |= test_regex_or_superstring();
	ret |= test_regex_or_superstring_exact();

	return ret;
}